

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

void enable_interrupt_cold_1(void)

{
  uint uVar1;
  long in_RSI;
  ulong in_RDI;
  ulong uVar2;
  long lVar3;
  
  uVar1 = (uint)in_RDI << 4;
  uVar2 = (long)((char)(in_RDI & 0xffff) * 2) & 0xfffffffffffffffc;
  *(uint *)(*(long *)(in_RSI + 0x70) + 0x900 + uVar2) =
       -0x80 << (uVar1 & 0x1f) |
       ~(0xff << (uVar1 & 0x1f)) & *(uint *)(*(long *)(in_RSI + 0x70) + 0x900 + uVar2);
  *(undefined4 *)(*(long *)(in_RSI + 0x70) + 0x810) = 0;
  lVar3 = 0x122a0;
  if ((ushort)in_RDI < 0x18) {
    lVar3 = 0x820;
  }
  *(undefined4 *)(*(long *)(in_RSI + 0x70) + lVar3 + (in_RDI & 0xffff) * 4) =
       *(undefined4 *)(in_RSI + 0x5c);
  *(undefined4 *)(*(long *)(in_RSI + 0x70) + 0x888) = 0xffffffff;
  *(uint *)(*(long *)(in_RSI + 0x70) + 0x880) =
       *(uint *)(*(long *)(in_RSI + 0x70) + 0x880) | 1 << ((uint)in_RDI & 0x1f);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Using MSI interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",0x96
          ,"enable_msi_interrupt");
  return;
}

Assistant:

static void enable_msi_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	// Step 1: The software driver associates between Tx and Rx interrupt causes and the EICR
	// register by setting the IVAR[n] registers.
	set_ivar(dev, 0, queue_id, 0);

	// Step 2: Program SRRCTL[n].RDMTS (per receive queue) if software uses the receive
	// descriptor minimum threshold interrupt
	// We don't use the minimum threshold interrupt

	// Step 3: All interrupts should be set to 0b (no auto clear in the EIAC register). Following an
	// interrupt, software might read the EICR register to check for the interrupt causes.
	set_reg32(dev->addr, IXGBE_EIAC, 0x00000000);

	// Step 4: Set the auto mask in the EIAM register according to the preferred mode of operation.
	// In our case we prefer not auto-masking the interrupts

	// Step 5: Set the interrupt throttling in EITR[n] and GPIE according to the preferred mode of operation.
	set_reg32(dev->addr, IXGBE_EITR(queue_id), dev->ixy.interrupts.itr_rate);

	// Step 6: Software clears EICR by writing all ones to clear old interrupt causes
	clear_interrupts(dev);

	// Step 7: Software enables the required interrupt causes by setting the EIMS register
	u32 mask = get_reg32(dev->addr, IXGBE_EIMS);
	mask |= (1 << queue_id);
	set_reg32(dev->addr, IXGBE_EIMS, mask);
	debug("Using MSI interrupts");
}